

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_engines.cc
# Opt level: O0

void advance_engine<trng::yarn3>(yarn3 *r1,long N)

{
  yarn3 *in_RSI;
  long i;
  undefined8 local_18;
  
  for (local_18 = 0; local_18 < (long)in_RSI; local_18 = local_18 + 1) {
    trng::yarn3::operator()(in_RSI);
  }
  return;
}

Assistant:

void advance_engine(R &r1, const long N) {
  for (long i{0}; i < N; ++i)
    r1();
}